

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::AddJoin(Clipper *this,OutPt *op1,OutPt *op2,IntPoint OffPt)

{
  pointer *pppJVar1;
  iterator __position;
  Join *j;
  Join *local_30;
  
  local_30 = (Join *)operator_new(0x20);
  local_30->OutPt1 = op1;
  local_30->OutPt2 = op2;
  (local_30->OffPt).X = OffPt.X;
  (local_30->OffPt).Y = OffPt.Y;
  __position._M_current =
       (this->m_Joins).super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_Joins).super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<ClipperLib::Join*,std::allocator<ClipperLib::Join*>>::
    _M_realloc_insert<ClipperLib::Join*const&>
              ((vector<ClipperLib::Join*,std::allocator<ClipperLib::Join*>> *)&this->m_Joins,
               __position,&local_30);
  }
  else {
    *__position._M_current = local_30;
    pppJVar1 = &(this->m_Joins).
                super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppJVar1 = *pppJVar1 + 1;
  }
  return;
}

Assistant:

void Clipper::AddJoin(OutPt *op1, OutPt *op2, const IntPoint OffPt)
{
  Join* j = new Join;
  j->OutPt1 = op1;
  j->OutPt2 = op2;
  j->OffPt = OffPt;
  m_Joins.push_back(j);
}